

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall c4::yml::Tree::add_tag_directive(Tree *this,TagDirective *td)

{
  csubstr *pcVar1;
  code *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  bool bVar12;
  int iVar13;
  size_t sVar14;
  size_t *psVar15;
  ro_substr chars;
  char msg [33];
  basic_substring<const_char> local_d8;
  char local_c8 [152];
  basic_substring<const_char> local_30;
  
  if (((td->handle).len == 0) || ((td->handle).str == (char *)0x0)) {
    builtin_strncpy(local_c8,"d.handle.empty()",0x11);
    local_d8.len._0_1_ = 'i';
    local_d8.len._1_1_ = 'l';
    local_d8.len._2_1_ = 'e';
    local_d8.len._3_1_ = 'd';
    local_d8.len._4_1_ = ':';
    local_d8.len._5_1_ = ' ';
    local_d8.len._6_1_ = '!';
    local_d8.len._7_1_ = 't';
    local_d8.str = (char *)0x6166206b63656863;
    if (((byte)s_error_flags & 1) != 0) {
      bVar12 = is_debugger_attached();
      if (bVar12) {
        pcVar2 = (code *)swi(3);
        sVar14 = (*pcVar2)();
        return sVar14;
      }
    }
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x6814) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x6814) << 0x40,8);
    LVar6.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar6.name.len = 0x65;
    (*(this->m_callbacks).m_error)((char *)&local_d8,0x21,LVar6,(this->m_callbacks).m_user_data);
  }
  if (((td->prefix).len == 0) || ((td->prefix).str == (char *)0x0)) {
    builtin_strncpy(local_c8,"d.prefix.empty()",0x11);
    local_d8.len._0_1_ = 'i';
    local_d8.len._1_1_ = 'l';
    local_d8.len._2_1_ = 'e';
    local_d8.len._3_1_ = 'd';
    local_d8.len._4_1_ = ':';
    local_d8.len._5_1_ = ' ';
    local_d8.len._6_1_ = '!';
    local_d8.len._7_1_ = 't';
    local_d8.str = (char *)0x6166206b63656863;
    if (((byte)s_error_flags & 1) != 0) {
      bVar12 = is_debugger_attached();
      if (bVar12) {
        pcVar2 = (code *)swi(3);
        sVar14 = (*pcVar2)();
        return sVar14;
      }
    }
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x6815) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x6815) << 0x40,8);
    LVar7.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar7.name.len = 0x65;
    (*(this->m_callbacks).m_error)((char *)&local_d8,0x21,LVar7,(this->m_callbacks).m_user_data);
  }
  sVar14 = (td->handle).len;
  if ((sVar14 == 0) || (*(td->handle).str != '!')) {
    builtin_strncpy(local_c8,"d.handle.begins_with(\'!\'))",0x1b);
    local_d8.len._0_1_ = 'i';
    local_d8.len._1_1_ = 'l';
    local_d8.len._2_1_ = 'e';
    local_d8.len._3_1_ = 'd';
    local_d8.len._4_1_ = ':';
    local_d8.len._5_1_ = ' ';
    local_d8.len._6_1_ = '(';
    local_d8.len._7_1_ = 't';
    local_d8.str = (char *)0x6166206b63656863;
    if (((byte)s_error_flags & 1) != 0) {
      bVar12 = is_debugger_attached();
      if (bVar12) {
        pcVar2 = (code *)swi(3);
        sVar14 = (*pcVar2)();
        return sVar14;
      }
    }
    LVar8.super_LineCol.col = 0;
    LVar8.super_LineCol.offset = SUB168(ZEXT816(0x6816) << 0x40,0);
    LVar8.super_LineCol.line = SUB168(ZEXT816(0x6816) << 0x40,8);
    LVar8.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar8.name.len = 0x65;
    (*(this->m_callbacks).m_error)((char *)&local_d8,0x2b,LVar8,(this->m_callbacks).m_user_data);
    sVar14 = (td->handle).len;
    if (sVar14 != 0) goto LAB_00212c37;
  }
  else {
LAB_00212c37:
    if ((td->handle).str[sVar14 - 1] == '!') goto LAB_00212cfb;
  }
  builtin_strncpy(local_c8,"d.handle.ends_with(\'!\'))",0x19);
  local_d8.len._0_1_ = 'i';
  local_d8.len._1_1_ = 'l';
  local_d8.len._2_1_ = 'e';
  local_d8.len._3_1_ = 'd';
  local_d8.len._4_1_ = ':';
  local_d8.len._5_1_ = ' ';
  local_d8.len._6_1_ = '(';
  local_d8.len._7_1_ = 't';
  local_d8.str = (char *)0x6166206b63656863;
  if (((byte)s_error_flags & 1) != 0) {
    bVar12 = is_debugger_attached();
    if (bVar12) {
      pcVar2 = (code *)swi(3);
      sVar14 = (*pcVar2)();
      return sVar14;
    }
  }
  LVar9.super_LineCol.col = 0;
  LVar9.super_LineCol.offset = SUB168(ZEXT816(0x6817) << 0x40,0);
  LVar9.super_LineCol.line = SUB168(ZEXT816(0x6817) << 0x40,8);
  LVar9.name.str =
       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  LVar9.name.len = 0x65;
  (*(this->m_callbacks).m_error)((char *)&local_d8,0x29,LVar9,(this->m_callbacks).m_user_data);
LAB_00212cfb:
  iVar13 = basic_substring<const_char>::compare(&td->handle,'!');
  if (iVar13 != 0) {
    iVar13 = basic_substring<const_char>::compare(&td->handle,"!!",2);
    if (iVar13 != 0) {
      local_d8 = basic_substring<const_char>::triml(&td->handle,'!');
      local_30 = basic_substring<const_char>::trimr(&local_d8,'!');
      chars.len = 0x40;
      chars.str = "01234567890abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-";
      sVar14 = basic_substring<const_char>::first_not_of(&local_30,chars,0);
      if (sVar14 != 0xffffffffffffffff) {
        memcpy(&local_d8,
               "check failed: (td.handle == \'!\' || td.handle == \"!!\" || td.handle.trim(\'!\').first_not_of(\"01234567890abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-\") == npos)"
               ,0xa6);
        if (((byte)s_error_flags & 1) != 0) {
          bVar12 = is_debugger_attached();
          if (bVar12) {
            pcVar2 = (code *)swi(3);
            sVar14 = (*pcVar2)();
            return sVar14;
          }
        }
        LVar10.super_LineCol.col = 0;
        LVar10.super_LineCol.offset = SUB168(ZEXT816(0x6819) << 0x40,0);
        LVar10.super_LineCol.line = SUB168(ZEXT816(0x6819) << 0x40,8);
        LVar10.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar10.name.len = 0x65;
        (*(this->m_callbacks).m_error)
                  ((char *)&local_d8,0xa6,LVar10,(this->m_callbacks).m_user_data);
      }
    }
  }
  psVar15 = &this->m_tag_directives[0].handle.len;
  sVar14 = 0;
  while ((*psVar15 != 0 && (((csubstr *)(psVar15 + -1))->str != (char *)0x0))) {
    sVar14 = sVar14 + 1;
    psVar15 = psVar15 + 5;
    if (sVar14 == 4) {
      sVar14 = 4;
LAB_00212e3f:
      builtin_strncpy(local_c8,"s < RYML_MAX_TAG_DIRECTIVES",0x1c);
      local_d8.len._0_1_ = 'i';
      local_d8.len._1_1_ = 'l';
      local_d8.len._2_1_ = 'e';
      local_d8.len._3_1_ = 'd';
      local_d8.len._4_1_ = ':';
      local_d8.len._5_1_ = ' ';
      local_d8.len._6_1_ = 'p';
      local_d8.len._7_1_ = 'o';
      local_d8.str = (char *)0x6166206b63656863;
      if (((byte)s_error_flags & 1) != 0) {
        bVar12 = is_debugger_attached();
        if (bVar12) {
          pcVar2 = (code *)swi(3);
          sVar14 = (*pcVar2)();
          return sVar14;
        }
      }
      LVar11.super_LineCol.col = 0;
      LVar11.super_LineCol.offset = SUB168(ZEXT816(0x681b) << 0x40,0);
      LVar11.super_LineCol.line = SUB168(ZEXT816(0x681b) << 0x40,8);
      LVar11.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar11.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_d8,0x2c,LVar11,(this->m_callbacks).m_user_data);
LAB_00212edd:
      this->m_tag_directives[sVar14].next_node_id = td->next_node_id;
      pcVar3 = (td->handle).str;
      sVar4 = (td->handle).len;
      sVar5 = (td->prefix).len;
      pcVar1 = &this->m_tag_directives[sVar14].prefix;
      pcVar1->str = (td->prefix).str;
      pcVar1->len = sVar5;
      this->m_tag_directives[sVar14].handle.str = pcVar3;
      this->m_tag_directives[sVar14].handle.len = sVar4;
      return sVar14;
    }
  }
  if (3 < sVar14) goto LAB_00212e3f;
  goto LAB_00212edd;
}

Assistant:

size_t Tree::add_tag_directive(TagDirective const& td)
{
    _RYML_CB_CHECK(m_callbacks, !td.handle.empty());
    _RYML_CB_CHECK(m_callbacks, !td.prefix.empty());
    _RYML_CB_ASSERT(m_callbacks, td.handle.begins_with('!'));
    _RYML_CB_ASSERT(m_callbacks, td.handle.ends_with('!'));
    // https://yaml.org/spec/1.2.2/#rule-ns-word-char
    _RYML_CB_ASSERT(m_callbacks, td.handle == '!' || td.handle == "!!" || td.handle.trim('!').first_not_of("01234567890abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-") == npos);
    size_t pos = num_tag_directives();
    _RYML_CB_CHECK(m_callbacks, pos < RYML_MAX_TAG_DIRECTIVES);
    m_tag_directives[pos] = td;
    return pos;
}